

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QHttpHeaders QNetworkHeadersPrivate::fromRawToHttp(RawHeadersList *raw)

{
  QLatin1StringView str;
  QByteArrayView a;
  QAnyStringView value_00;
  QAnyStringView value_01;
  QAnyStringView name;
  QAnyStringView name_00;
  bool bVar1;
  int iVar2;
  pair<QByteArray,_QByteArray> *ppVar3;
  iterator *this;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RSI;
  QHttpHeadersPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  TokenizerResult<const_QLatin1String_&,_QLatin1Char> *__range3;
  bool isSetCookie;
  type *value;
  type *key;
  RawHeadersList *__range1;
  QHttpHeaders *headers;
  QLatin1String header;
  sentinel __end3;
  iterator __begin3;
  const_iterator __end1;
  const_iterator __begin1;
  undefined6 in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe8e;
  undefined1 in_stack_fffffffffffffe8f;
  QList<std::pair<QByteArray,_QByteArray>_> *in_stack_fffffffffffffe90;
  QExplicitlySharedDataPointer<QHttpHeadersPrivate> this_00;
  char *in_stack_fffffffffffffea8;
  QStringTokenizerBase<QLatin1String,_QChar> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 uVar5;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar6;
  QHttpHeadersPrivate *pQVar7;
  undefined1 local_90 [63];
  char local_51;
  pair<QByteArray,_QByteArray> *local_40;
  const_iterator local_38;
  const_iterator local_30;
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QHttpHeadersPrivate_*>)
       (totally_ordered_wrapper<QHttpHeadersPrivate_*>)in_RDI;
  pQVar7 = in_RDI;
  bVar1 = QList<std::pair<QByteArray,_QByteArray>_>::empty
                    ((QList<std::pair<QByteArray,_QByteArray>_> *)0x1f543d);
  if (bVar1) {
    QHttpHeaders::QHttpHeaders((QHttpHeaders *)0x1f544d);
  }
  else {
    uVar5 = 0;
    *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
    QHttpHeaders::QHttpHeaders((QHttpHeaders *)0x1f546b);
    QList<std::pair<QByteArray,_QByteArray>_>::size
              ((QList<std::pair<QByteArray,_QByteArray>_> *)in_RSI.m_data);
    QHttpHeaders::reserve
              ((QHttpHeaders *)in_stack_fffffffffffffe90,
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)));
    local_30.i = (pair<QByteArray,_QByteArray> *)0xaaaaaaaaaaaaaaaa;
    aVar6 = in_RSI;
    local_30 = QList<std::pair<QByteArray,_QByteArray>_>::begin(in_stack_fffffffffffffe90);
    local_38.i = (pair<QByteArray,_QByteArray> *)0xaaaaaaaaaaaaaaaa;
    local_38 = QList<std::pair<QByteArray,_QByteArray>_>::end(in_stack_fffffffffffffe90);
    while( true ) {
      local_40 = local_38.i;
      bVar1 = QList<std::pair<QByteArray,_QByteArray>_>::const_iterator::operator!=
                        (&local_30,local_38);
      if (!bVar1) break;
      ppVar3 = QList<std::pair<QByteArray,_QByteArray>_>::const_iterator::operator*(&local_30);
      this = (iterator *)
             std::get<0ul,QByteArray,QByteArray>((pair<QByteArray,_QByteArray> *)0x1f5545);
      std::get<1ul,QByteArray,QByteArray>((pair<QByteArray,_QByteArray> *)0x1f5563);
      QVar4 = QHttpHeaders::wellKnownHeaderName((WellKnownHeader)((ulong)this >> 0x20));
      a.m_data = (storage_type *)in_RSI.m_data;
      a.m_size = (qsizetype)ppVar3;
      iVar2 = QByteArray::compare((QByteArray *)QVar4.m_size,a,
                                  (CaseSensitivity)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      if (iVar2 == 0) {
        QLatin1String::QLatin1String((QLatin1String *)this_00.d.ptr,(QByteArray *)in_RDI);
        local_51 = (char)Qt::Literals::StringLiterals::operator____L1(in_stack_fffffffffffffe8e);
        QLatin1String::tokenize<QLatin1Char>
                  ((QLatin1String *)this,
                   (QLatin1Char *)
                   CONCAT17(in_stack_fffffffffffffe8f,
                            CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)));
        in_stack_fffffffffffffeb0 = &local_28;
        memset(local_90,0xaa,0x38);
        QStringTokenizerBase<QLatin1String,_QChar>::begin
                  ((QStringTokenizerBase<QLatin1String,_QChar> *)this);
        QStringTokenizerBase<QLatin1String,_QChar>::end(in_stack_fffffffffffffeb0);
        while (bVar1 = ::operator!=(local_90), bVar1) {
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*((iterator *)0x1f5690);
          QAnyStringView::QAnyStringView((QAnyStringView *)this_00.d.ptr,(QByteArray *)in_RDI);
          str.m_data = in_stack_fffffffffffffea8;
          str.m_size = (qsizetype)this_00.d.ptr;
          QAnyStringView::QAnyStringView((QAnyStringView *)in_RDI,str);
          name.m_size = (size_t)pQVar7;
          name.field_0.m_data = aVar6.m_data;
          value_00.m_size._0_7_ = in_stack_fffffffffffffef0;
          value_00.field_0.m_data = in_RSI.m_data;
          value_00.m_size._7_1_ = uVar5;
          QHttpHeaders::append((QHttpHeaders *)in_RDI,name,value_00);
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator++(this);
        }
      }
      else {
        QAnyStringView::QAnyStringView((QAnyStringView *)this_00.d.ptr,(QByteArray *)in_RDI);
        QAnyStringView::QAnyStringView((QAnyStringView *)this_00.d.ptr,(QByteArray *)in_RDI);
        name_00.m_size = (size_t)pQVar7;
        name_00.field_0.m_data = aVar6.m_data;
        value_01.m_size._0_7_ = in_stack_fffffffffffffef0;
        value_01.field_0.m_data = in_RSI.m_data;
        value_01.m_size._7_1_ = uVar5;
        QHttpHeaders::append((QHttpHeaders *)in_RDI,name_00,value_01);
      }
      QList<std::pair<QByteArray,_QByteArray>_>::const_iterator::operator++(&local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)
           (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QHttpHeaders QNetworkHeadersPrivate::fromRawToHttp(const RawHeadersList &raw)
{
    if (raw.empty())
        return {};

    QHttpHeaders headers;
    headers.reserve(raw.size());

    for (const auto &[key, value] : raw) {
        const bool isSetCookie = key.compare(QHttpHeaders::wellKnownHeaderName(
                                             QHttpHeaders::WellKnownHeader::SetCookie),
                                             Qt::CaseInsensitive) == 0;
        if (isSetCookie) {
            for (auto header : QLatin1StringView(value).tokenize('\n'_L1))
                headers.append(key, header);
        } else {
            headers.append(key, value);
        }
    }

    return headers;
}